

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void store(item *x,item *y)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  typeDesc *ptVar4;
  typeDesc *ptVar5;
  instrStruct *piVar6;
  int iVar7;
  int b;
  int op;
  char *msg;
  
  ptVar4 = getType(x->typeIndex);
  ptVar5 = getType(y->typeIndex);
  uVar2 = ptVar4->form - 800;
  if (((5 < uVar2) || ((0x33U >> (uVar2 & 0x1f) & 1) == 0)) || (ptVar4->form != ptVar5->form)) {
    msg = "incompatible assignment";
LAB_00108304:
    mark(msg);
    exit(-1);
  }
  iVar3 = y->mode;
  if ((iVar3 != 0x2c0) && (iVar3 != 0x2c2)) {
    if (iVar3 == 0x2c3) {
      uVar2 = y->c - 0x66;
      iVar3 = 0;
      if (uVar2 < 6) {
        iVar3 = *(int *)(&DAT_0010a3d0 + (ulong)uVar2 * 4);
      }
      put(iVar3,y->r,0,y->a);
      regs[y->r] = 0;
      y->a = pc + -1;
      fixLink(y->b);
      iVar3 = getReg();
      y->r = iVar3;
      iVar7 = bigNum;
      lVar1 = (long)bigNum;
      piVar6 = (instrStruct *)calloc(1,0x10);
      piVar6->instr = (iVar3 << 0x15 | (uint)(1 % lVar1)) + 0x40000000;
      piVar6->next = lastInstr->next;
      lastInstr->next = piVar6;
      iVar3 = pc;
      pc = pc + 1;
      lastInstr = piVar6;
      lastInstr = (instrStruct *)calloc(1,0x10);
      lastInstr->instr = (uint)(2 % (long)iVar7) | 0xa0000000;
      lastInstr->next = piVar6->next;
      piVar6->next = lastInstr;
      pc = iVar3 + 2;
      fixLink(y->a);
      iVar3 = y->r;
      piVar6 = (instrStruct *)calloc(1,0x10);
      piVar6->instr = iVar3 * 0x200000 + 0x40000000;
      piVar6->next = lastInstr->next;
      lastInstr->next = piVar6;
      pc = pc + 1;
      lastInstr = piVar6;
    }
    else {
      load(y);
    }
  }
  if (x->mode != 0x2c6) {
    if (x->mode != 0x2c1) {
      msg = "illegal assignment";
      goto LAB_00108304;
    }
    if (x->lev == 0) {
      x->a = x->a + RISC_MEMSIZE;
    }
    iVar3 = x->hs;
    if (iVar3 == 0) {
      iVar3 = y->r;
      iVar7 = x->a;
      b = x->r;
      op = 0x24;
      goto LAB_001082b1;
    }
    lVar1 = (long)bigNum;
    piVar6 = (instrStruct *)calloc(1,0x10);
    piVar6->instr = (iVar3 << 0x15 | (uint)(3 % lVar1)) + 0xa0000000;
    piVar6->next = lastInstr->next;
    lastInstr->next = piVar6;
    pc = pc + 1;
    lastInstr = piVar6;
    put(0x24,y->r,x->r,x->a);
    lVar1 = (long)bigNum;
    piVar6 = (instrStruct *)calloc(1,0x10);
    piVar6->instr = (uint)(2 % lVar1) | 0xa0000000;
    piVar6->next = lastInstr->next;
    lastInstr->next = piVar6;
    pc = pc + 1;
    lastInstr = piVar6;
  }
  iVar3 = y->r;
  iVar7 = x->a;
  b = x->r;
  op = 0x34;
LAB_001082b1:
  put(op,iVar3,b,iVar7);
  regs[x->hs] = 0;
  regs[y->r] = 0;
  regs[x->r] = 0;
  return;
}

Assistant:

procedure 
void store(struct item *x, struct item *y) {
	variable struct typeDesc *typeX; variable struct typeDesc *typeY;variable int r;
	variable int op;typeX = NULL; typeY = NULL; op = 0; 

	/* get the type of both items */
	typeX = getType(x->typeIndex); typeY = getType(y->typeIndex);

	/* type checking */
	if (((typeX->form == FORM_INT) || (typeX->form == FORM_CHAR) || 
		(typeX->form == FORM_REF) || (typeX->form == FORM_BOOL)) && (typeX->form == typeY->form)) {
		
		/* handle conditon on right hand side of assignment */
		if (y->mode == CLASS_COND) {
			op = selectOpNegated(y->c);
			put(op, y->r, 0, y->a); 
			regs[y->r] = 0; 
			y->a = pc - 1;
			fixLink(y->b); 
			r = getReg();
			y->r = r; 
			put(RISC_ADDI,y->r,0,1); 
			put(RISC_BEQ,0,0,2);
			fixLink(y->a); 
			put(RISC_ADDI,y->r,0,0);
		} elsif ((y->mode != CLASS_REG) && (y->mode != CLASS_PROC)) {
			load(y);
		}
		if (x->mode == CLASS_VAR) {
			if (x->lev == 0) {
				x->a = RISC_MEMSIZE + x->a;
			}
			if (x->hs != 0) { 
				put(RISC_BEQ,x->hs,0,3); 
				put(RISC_STW,y->r,x->r,x->a); 
				put(RISC_BEQ,0,0,2);
				put(RISC_HSTW,y->r,x->r,x->a); 
			} else {
				put(RISC_STW,y->r,x->r,x->a); 
			}
		} elsif (x->mode == CLASS_IND) { 
			put(RISC_HSTW,y->r,x->r,x->a);
		} else {
			mark("illegal assignment");
			exit(-1);
		}
		regs[x->hs] = 0;
		regs[y->r]  = 0;
		regs[x->r]  = 0;
	} else {
		mark("incompatible assignment");
		exit(-1);
	}	
}